

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select_node.cpp
# Opt level: O2

string * __thiscall
duckdb::SelectNode::ToString_abi_cxx11_(string *__return_storage_ptr__,SelectNode *this)

{
  unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *this_00;
  GroupByNode *this_01;
  unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true> *this_02;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *this_03;
  GroupByNode *pGVar1;
  bool bVar2;
  pointer pTVar3;
  const_reference pvVar4;
  pointer pRVar5;
  DistinctModifier *pDVar6;
  reference this_04;
  pointer pPVar7;
  const_reference pvVar8;
  const_reference pvVar9;
  _Base_ptr p_Var10;
  pointer pSVar11;
  idx_t __val;
  idx_t k;
  ulong __n;
  vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_true>
  *this_05;
  idx_t modifier_idx;
  ulong uVar12;
  SelectNode *this_06;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_true>
  *local_b0;
  SelectNode *local_a8;
  string result;
  string local_70;
  string local_50 [32];
  
  this_00 = &this->from_table;
  if (((this->from_table).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>
       ._M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
       super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl != (TableRef *)0x0) &&
     (pTVar3 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator->
                         (this_00), pTVar3->type == SHOW_REF)) {
    pTVar3 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator->
                       (this_00);
    (*pTVar3->_vptr_TableRef[2])(__return_storage_ptr__,pTVar3);
    return __return_storage_ptr__;
  }
  result._M_dataplus._M_p = (pointer)&result.field_2;
  result._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  CommonTableExpressionMap::ToString_abi_cxx11_(&local_f0,&(this->super_QueryNode).cte_map);
  ::std::__cxx11::string::operator=((string *)&result,(string *)&local_f0);
  ::std::__cxx11::string::~string((string *)&local_f0);
  ::std::__cxx11::string::append((char *)&result);
  this_05 = &(this->super_QueryNode).modifiers;
  local_b0 = this_05;
  local_a8 = this;
  for (uVar12 = 0;
      uVar12 < (ulong)((long)(this->super_QueryNode).modifiers.
                             super_vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->super_QueryNode).modifiers.
                             super_vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3); uVar12 = uVar12 + 1) {
    pvVar4 = vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_true>
             ::get<true>(this_05,uVar12);
    pRVar5 = unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>::
             operator->(pvVar4);
    if (pRVar5->type == DISTINCT_MODIFIER) {
      pvVar4 = vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_true>
               ::get<true>(this_05,uVar12);
      pRVar5 = unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
               ::operator->(pvVar4);
      pDVar6 = ResultModifier::Cast<duckdb::DistinctModifier>(pRVar5);
      ::std::__cxx11::string::append((char *)&result);
      if ((pDVar6->distinct_on_targets).
          super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pDVar6->distinct_on_targets).
          super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        ::std::__cxx11::string::append((char *)&result);
        for (__n = 0; __n < (ulong)((long)(pDVar6->distinct_on_targets).
                                          super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                          .
                                          super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(pDVar6->distinct_on_targets).
                                          super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                          .
                                          super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3);
            __n = __n + 1) {
          if (__n != 0) {
            ::std::__cxx11::string::append((char *)&result);
          }
          this_04 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                    ::get<true>(&pDVar6->distinct_on_targets,__n);
          pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   ::operator->(this_04);
          (*(pPVar7->super_BaseExpression)._vptr_BaseExpression[8])(&local_f0,pPVar7);
          ::std::__cxx11::string::append((string *)&result);
          ::std::__cxx11::string::~string((string *)&local_f0);
        }
        ::std::__cxx11::string::append((char *)&result);
        this_05 = local_b0;
        this = local_a8;
      }
    }
  }
  this_03 = &this->select_list;
  for (uVar12 = 0; this_06 = local_a8,
      uVar12 < (ulong)((long)(local_a8->select_list).
                             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(local_a8->select_list).
                             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3); uVar12 = uVar12 + 1) {
    if (uVar12 != 0) {
      ::std::__cxx11::string::append((char *)&result);
    }
    pvVar8 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
             ::get<true>(this_03,uVar12);
    pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(pvVar8);
    (*(pPVar7->super_BaseExpression)._vptr_BaseExpression[8])(&local_f0,pPVar7);
    ::std::__cxx11::string::append((string *)&result);
    ::std::__cxx11::string::~string((string *)&local_f0);
    pvVar8 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
             ::get<true>(this_03,uVar12);
    pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(pvVar8);
    if ((pPVar7->super_BaseExpression).alias._M_string_length != 0) {
      ::std::__cxx11::string::string((string *)&local_70," AS %s",(allocator *)&local_d0);
      pvVar8 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
               ::get<true>(this_03,uVar12);
      pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(pvVar8);
      ::std::__cxx11::string::string(local_50,(string *)&(pPVar7->super_BaseExpression).alias);
      StringUtil::Format<duckdb::SQLIdentifier>(&local_f0,&local_70,(SQLIdentifier *)local_50);
      ::std::__cxx11::string::append((string *)&result);
      ::std::__cxx11::string::~string((string *)&local_f0);
      ::std::__cxx11::string::~string(local_50);
      ::std::__cxx11::string::~string((string *)&local_70);
    }
  }
  if (((this_00->super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)._M_t.
       super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
       super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl != (TableRef *)0x0) &&
     (pTVar3 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator->
                         (this_00), pTVar3->type != EMPTY_FROM)) {
    pTVar3 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator->
                       (this_00);
    (*pTVar3->_vptr_TableRef[2])(&local_d0,pTVar3);
    ::std::operator+(&local_f0," FROM ",&local_d0);
    ::std::__cxx11::string::append((string *)&result);
    ::std::__cxx11::string::~string((string *)&local_f0);
    ::std::__cxx11::string::~string((string *)&local_d0);
  }
  if ((this_06->where_clause).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
      (ParsedExpression *)0x0) {
    pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(&this_06->where_clause);
    (*(pPVar7->super_BaseExpression)._vptr_BaseExpression[8])(&local_d0,pPVar7);
    ::std::operator+(&local_f0," WHERE ",&local_d0);
    ::std::__cxx11::string::append((string *)&result);
    ::std::__cxx11::string::~string((string *)&local_f0);
    ::std::__cxx11::string::~string((string *)&local_d0);
  }
  if ((this_06->groups).grouping_sets.
      super_vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
      .
      super__Vector_base<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this_06->groups).grouping_sets.
      super_vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
      .
      super__Vector_base<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if (this_06->aggregate_handling == FORCE_AGGREGATES) {
      ::std::__cxx11::string::append((char *)&result);
    }
  }
  else {
    ::std::__cxx11::string::append((char *)&result);
    local_b0 = (vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_true>
                *)(((long)(this_06->groups).grouping_sets.
                          super_vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                          .
                          super__Vector_base<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this_06->groups).grouping_sets.
                         super_vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                         .
                         super__Vector_base<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x30);
    if ((vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_true>
         *)0x1 < local_b0) {
      ::std::__cxx11::string::append((char *)&result);
    }
    this_01 = &this_06->groups;
    pGVar1 = &this_06->groups;
    for (uVar12 = 0; this_06 = local_a8,
        uVar12 < (ulong)(((long)(local_a8->groups).grouping_sets.
                                super_vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                                .
                                super__Vector_base<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(local_a8->groups).grouping_sets.
                               super_vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                               .
                               super__Vector_base<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x30);
        uVar12 = uVar12 + 1) {
      pvVar9 = vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_true>
               ::get<true>(&pGVar1->grouping_sets,uVar12);
      if (uVar12 != 0) {
        ::std::__cxx11::string::append((char *)&result);
      }
      if ((pvVar9->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
        ::std::__cxx11::string::append((char *)&result);
      }
      else {
        if ((vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_true>
             *)0x1 < local_b0) {
          ::std::__cxx11::string::append((char *)&result);
        }
        p_Var10 = (pvVar9->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        bVar2 = true;
        while ((_Rb_tree_header *)p_Var10 != &(pvVar9->_M_t)._M_impl.super__Rb_tree_header) {
          if (!bVar2) {
            ::std::__cxx11::string::append((char *)&result);
          }
          pvVar8 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                   ::get<true>(&this_01->group_expressions,*(size_type *)(p_Var10 + 1));
          pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   ::operator->(pvVar8);
          (*(pPVar7->super_BaseExpression)._vptr_BaseExpression[8])(&local_f0,pPVar7);
          ::std::__cxx11::string::append((string *)&result);
          ::std::__cxx11::string::~string((string *)&local_f0);
          p_Var10 = (_Base_ptr)::std::_Rb_tree_increment(p_Var10);
          bVar2 = false;
        }
        if ((vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_true>
             *)0x1 < local_b0) {
          ::std::__cxx11::string::append((char *)&result);
        }
      }
    }
    if ((vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_true>
         *)0x1 < local_b0) {
      ::std::__cxx11::string::append((char *)&result);
    }
  }
  if ((this_06->having).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
      (ParsedExpression *)0x0) {
    pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(&this_06->having);
    (*(pPVar7->super_BaseExpression)._vptr_BaseExpression[8])(&local_d0,pPVar7);
    ::std::operator+(&local_f0," HAVING ",&local_d0);
    ::std::__cxx11::string::append((string *)&result);
    ::std::__cxx11::string::~string((string *)&local_f0);
    ::std::__cxx11::string::~string((string *)&local_d0);
  }
  if ((this_06->qualify).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
      (ParsedExpression *)0x0) {
    pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(&this_06->qualify);
    (*(pPVar7->super_BaseExpression)._vptr_BaseExpression[8])(&local_d0,pPVar7);
    ::std::operator+(&local_f0," QUALIFY ",&local_d0);
    ::std::__cxx11::string::append((string *)&result);
    ::std::__cxx11::string::~string((string *)&local_f0);
    ::std::__cxx11::string::~string((string *)&local_d0);
  }
  if ((this_06->sample).
      super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
      super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>.
      super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl != (SampleOptions *)0x0) {
    ::std::__cxx11::string::append((char *)&result);
    this_02 = &this_06->sample;
    pSVar11 = unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>::
              operator->(this_02);
    Value::ToString_abi_cxx11_(&local_f0,&pSVar11->sample_size);
    ::std::__cxx11::string::append((string *)&result);
    ::std::__cxx11::string::~string((string *)&local_f0);
    pSVar11 = unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>::
              operator->(this_02);
    if (pSVar11->is_percentage == true) {
      ::std::__cxx11::string::append((char *)&result);
    }
    pSVar11 = unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>::
              operator->(this_02);
    EnumUtil::ToString<duckdb::SampleMethod>(&local_d0,pSVar11->method);
    ::std::operator+(&local_f0," (",&local_d0);
    ::std::__cxx11::string::append((string *)&result);
    ::std::__cxx11::string::~string((string *)&local_f0);
    ::std::__cxx11::string::~string((string *)&local_d0);
    pSVar11 = unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>::
              operator->(this_02);
    if ((pSVar11->seed).index != 0xffffffffffffffff) {
      pSVar11 = unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>
                ::operator->(this_02);
      __val = optional_idx::GetIndex(&pSVar11->seed);
      ::std::__cxx11::to_string(&local_d0,__val);
      ::std::operator+(&local_f0,", ",&local_d0);
      ::std::__cxx11::string::append((string *)&result);
      ::std::__cxx11::string::~string((string *)&local_f0);
      ::std::__cxx11::string::~string((string *)&local_d0);
    }
    ::std::__cxx11::string::append((char *)&result);
  }
  QueryNode::ResultModifiersToString_abi_cxx11_(&local_f0,&this_06->super_QueryNode);
  ::std::operator+(__return_storage_ptr__,&result,&local_f0);
  ::std::__cxx11::string::~string((string *)&local_f0);
  ::std::__cxx11::string::~string((string *)&result);
  return __return_storage_ptr__;
}

Assistant:

string SelectNode::ToString() const {
	if (from_table && from_table->type == TableReferenceType::SHOW_REF) {
		D_ASSERT(select_list.size() == 1);
		return from_table->ToString();
	}
	string result;
	result = cte_map.ToString();
	result += "SELECT ";

	// search for a distinct modifier
	for (idx_t modifier_idx = 0; modifier_idx < modifiers.size(); modifier_idx++) {
		if (modifiers[modifier_idx]->type == ResultModifierType::DISTINCT_MODIFIER) {
			auto &distinct_modifier = modifiers[modifier_idx]->Cast<DistinctModifier>();
			result += "DISTINCT ";
			if (!distinct_modifier.distinct_on_targets.empty()) {
				result += "ON (";
				for (idx_t k = 0; k < distinct_modifier.distinct_on_targets.size(); k++) {
					if (k > 0) {
						result += ", ";
					}
					result += distinct_modifier.distinct_on_targets[k]->ToString();
				}
				result += ") ";
			}
		}
	}
	for (idx_t i = 0; i < select_list.size(); i++) {
		if (i > 0) {
			result += ", ";
		}
		result += select_list[i]->ToString();
		if (!select_list[i]->GetAlias().empty()) {
			result += StringUtil::Format(" AS %s", SQLIdentifier(select_list[i]->GetAlias()));
		}
	}
	if (from_table && from_table->type != TableReferenceType::EMPTY_FROM) {
		result += " FROM " + from_table->ToString();
	}
	if (where_clause) {
		result += " WHERE " + where_clause->ToString();
	}
	if (!groups.grouping_sets.empty()) {
		result += " GROUP BY ";
		// if we are dealing with multiple grouping sets, we have to add a few additional brackets
		bool grouping_sets = groups.grouping_sets.size() > 1;
		if (grouping_sets) {
			result += "GROUPING SETS (";
		}
		for (idx_t i = 0; i < groups.grouping_sets.size(); i++) {
			auto &grouping_set = groups.grouping_sets[i];
			if (i > 0) {
				result += ",";
			}
			if (grouping_set.empty()) {
				result += "()";
				continue;
			}
			if (grouping_sets) {
				result += "(";
			}
			bool first = true;
			for (auto &grp : grouping_set) {
				if (!first) {
					result += ", ";
				}
				result += groups.group_expressions[grp]->ToString();
				first = false;
			}
			if (grouping_sets) {
				result += ")";
			}
		}
		if (grouping_sets) {
			result += ")";
		}
	} else if (aggregate_handling == AggregateHandling::FORCE_AGGREGATES) {
		result += " GROUP BY ALL";
	}
	if (having) {
		result += " HAVING " + having->ToString();
	}
	if (qualify) {
		result += " QUALIFY " + qualify->ToString();
	}
	if (sample) {
		result += " USING SAMPLE ";
		result += sample->sample_size.ToString();
		if (sample->is_percentage) {
			result += "%";
		}
		result += " (" + EnumUtil::ToString(sample->method);
		if (sample->seed.IsValid()) {
			result += ", " + std::to_string(sample->seed.GetIndex());
		}
		result += ")";
	}
	return result + ResultModifiersToString();
}